

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableBreakingLogic.cpp
# Opt level: O1

WidthVector * __thiscall
KDReports::TableBreakingLogic::widthPerPage
          (WidthVector *__return_storage_ptr__,TableBreakingLogic *this,QVector<int> *colPerPage)

{
  uint uVar1;
  int iVar2;
  qsizetype size;
  ulong uVar3;
  reference pdVar4;
  undefined8 extraout_RAX;
  uint uVar5;
  ulong uVar6;
  QArrayDataPointer<double> *unaff_RBX;
  ulong uVar7;
  uint uVar8;
  ulong i;
  double local_30;
  
  size = (colPerPage->d).size;
  if (this->m_pages < size) {
LAB_0010a79e:
    widthPerPage();
    QArrayDataPointer<double>::~QArrayDataPointer(unaff_RBX);
    _Unwind_Resume(extraout_RAX);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (double *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<double>::resize(__return_storage_ptr__,size);
  uVar3 = (colPerPage->d).size;
  if (0 < (long)uVar3) {
    i = 0;
    uVar5 = 0;
    do {
      if (uVar3 <= i) {
LAB_0010a799:
        widthPerPage();
        unaff_RBX = &__return_storage_ptr__->d;
        goto LAB_0010a79e;
      }
      iVar2 = (colPerPage->d).ptr[i];
      uVar1 = iVar2 + uVar5;
      if (iVar2 < 1) {
        local_30 = 0.0;
      }
      else {
        uVar3 = (this->m_widths).d.size;
        uVar6 = (ulong)(int)uVar5;
        uVar7 = 0;
        if (uVar6 <= uVar3) {
          uVar7 = uVar3 - uVar6;
        }
        uVar8 = uVar5 + 1;
        if ((int)(uVar5 + 1) < (int)uVar1) {
          uVar8 = uVar1;
        }
        local_30 = 0.0;
        do {
          if (uVar7 <= ~uVar5 + uVar8) {
            widthPerPage();
            goto LAB_0010a799;
          }
          local_30 = local_30 + (this->m_widths).d.ptr[uVar6];
          uVar6 = uVar6 + 1;
        } while ((long)uVar6 < (long)(int)uVar1);
      }
      pdVar4 = QList<double>::operator[](__return_storage_ptr__,i);
      *pdVar4 = local_30;
      i = i + 1;
      uVar3 = (colPerPage->d).size;
      uVar5 = uVar1;
    } while ((long)i < (long)uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

TableBreakingLogic::WidthVector TableBreakingLogic::widthPerPage(const QVector<int> &colPerPage) const
{
    Q_ASSERT(colPerPage.size() <= m_pages);
    int startColumn = 0;
    WidthVector widths;
    widths.resize(colPerPage.size());
    for (int page = 0; page < colPerPage.size(); ++page) {
        const int numColumnsForPage = colPerPage[page];
        qreal pageTotalWidth = 0;
        for (int i = startColumn; i < startColumn + numColumnsForPage; ++i) {
            pageTotalWidth += m_widths[i];
        }
        startColumn += numColumnsForPage;
        widths[page] = pageTotalWidth;
    }
    return widths;
}